

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-memory-read-test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t size;
  char *__s;
  mtar_t tar;
  mtar_header_t h;
  char data [256];
  
  if (argc < 2) {
    puts("error: no argument");
    iVar2 = 1;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      __s = "error: unable to open";
LAB_001012e4:
      puts(__s);
      iVar2 = 6;
    }
    else {
      size = fread(main::buf,1,4000,__stream);
      if (size == 0) {
        puts("error: unable to read");
        fclose(__stream);
        iVar2 = 7;
      }
      else {
        fclose(__stream);
        uVar1 = mtar_open_memory(&tar,main::buf,size);
        if (uVar1 == 0) {
          while (uVar1 = mtar_read_header(&tar,&h), uVar1 == 0) {
            printf("%s (%d bytes)\n",h.name,(ulong)(uint)h.size);
            if (CONCAT44(h.size._4_4_,(uint)h.size) - 0x100 < 0xfffffffffffffeff) {
              __s = "error: too large";
              goto LAB_001012e4;
            }
            uVar1 = mtar_read_data(&tar,data,CONCAT44(h.size._4_4_,(uint)h.size));
            if (uVar1 != 0) {
              printf("error: %d\n",(ulong)uVar1);
              return 4;
            }
            data[CONCAT44(h.size._4_4_,(uint)h.size)] = '\0';
            puts(data);
            mtar_next(&tar);
          }
          if (uVar1 == 0xfffffff9) {
            uVar1 = mtar_close(&tar);
            if (uVar1 == 0) {
              puts("success");
              iVar2 = 0;
            }
            else {
              printf("error: %d\n",(ulong)uVar1);
              iVar2 = 3;
            }
          }
          else {
            printf("error: %d\n",(ulong)uVar1);
            iVar2 = 5;
          }
        }
        else {
          printf("error: %d\n",(ulong)uVar1);
          iVar2 = 2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    mtar_header_t h;

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    if (!fp)
    {
        printf("error: unable to open\n");
        return 6;
    }

    static char buf[4000];
    size_t size = fread(buf, 1, 4000, fp);
    if (!size)
    {
        printf("error: unable to read\n");
        fclose(fp);
        return 7;
    }
    fclose(fp);

    if (int error = mtar_open_memory(&tar, buf, size))
    {
        printf("error: %d\n", error);
        return 2;
    }

    for (;;)
    {
        if (int error = mtar_read_header(&tar, &h))
        {
            if (error == MTAR_ENULLRECORD)
            {
                break;
            }
            printf("error: %d\n", error);
            return 5;
        }
        printf("%s (%d bytes)\n", h.name, (int)h.size);

        char data[256];
        if (h.size + 1 > sizeof(data))
        {
            printf("error: too large\n");
            return 6;
        }

        if (int error = mtar_read_data(&tar, data, h.size))
        {
            printf("error: %d\n", error);
            return 4;
        }
        data[h.size] = 0;

        puts(data);
        mtar_next(&tar);
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    puts("success");
    return 0;
}